

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_basic.c
# Opt level: O2

void verify_sparse_file(archive *a,char *path,sparse *sparse,int expected_holes)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  void *pvVar4;
  archive *extra;
  wchar_t wVar5;
  int iVar6;
  archive_entry *paVar7;
  la_int64_t lVar8;
  la_int64_t v2;
  void *pvVar9;
  long lVar10;
  size_t sVar11;
  void *_v1;
  long v1;
  char cVar12;
  char *pcVar13;
  undefined8 uVar14;
  int64_t offset;
  void *buff;
  void *local_68;
  ulong local_60;
  size_t bytes_read;
  uint local_4c;
  archive *local_48;
  char *local_40;
  archive_entry *local_38;
  
  local_4c = expected_holes;
  create_sparse_file(path,sparse);
  paVar7 = archive_entry_new();
  lVar10 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'œ',(uint)(paVar7 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  local_40 = path;
  wVar5 = archive_read_disk_open(a,path);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'Ŕ',0,"ARCHIVE_OK",(long)wVar5,"archive_read_disk_open(a, path)",a);
  local_38 = paVar7;
  iVar6 = archive_read_next_header2(a,paVar7);
  local_48 = a;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'ŕ',0,"ARCHIVE_OK",(long)iVar6,"archive_read_next_header2(a, ae)",a);
  local_60 = 0;
  v1 = 0;
  do {
    iVar6 = archive_read_data_block(local_48,&buff,&bytes_read,&offset);
    paVar7 = local_38;
    if (iVar6 != 0) {
      lVar8 = archive_entry_size(local_38);
      for (; sparse->type == HOLE; sparse = sparse + 1) {
        v1 = v1 + sparse->size;
      }
      iVar6 = (int)local_60;
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                       ,L'ƴ',(uint)(sparse->type == END),"sparse->type == END",(void *)0x0);
      v2 = archive_entry_size(paVar7);
      uVar14 = 0;
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                          ,L'Ƶ',v1,"expected_offset",v2,"archive_entry_size(ae)",(void *)0x0);
      failure("%s",local_40,0x1c11c9,uVar14);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                          ,L'Ƹ',(ulong)(iVar6 + (uint)(lVar10 < lVar8)),"holes_seen",
                          (ulong)local_4c,"expected_holes",(void *)0x0);
      extra = local_48;
      iVar6 = archive_read_close(local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                          ,L'ƺ',0,"ARCHIVE_OK",(long)iVar6,"archive_read_close(a)",extra);
      archive_entry_free(paVar7);
      return;
    }
    local_68 = buff;
    bVar3 = lVar10 < offset;
    while( true ) {
      lVar10 = sparse->size + v1;
      if (offset <= lVar10) break;
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                       ,L'Ũ',(uint)(sparse->type == HOLE),"sparse->type == HOLE",(void *)0x0);
      v1 = v1 + sparse->size;
      sparse = sparse + 1;
    }
    _v1 = local_68;
    if ((v1 < offset) && (lVar10 <= (long)(offset + bytes_read))) {
      _v1 = (void *)((long)buff + sparse->size + (v1 - offset));
      if (sparse->type == HOLE) {
        wVar5 = L'Ŵ';
        pcVar13 = "\'\\0\'";
        cVar12 = '\0';
LAB_001c0f81:
        assertion_memory_filled_with
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,wVar5,local_68,"start",(long)_v1 - (long)local_68,"end - start",cVar12,pcVar13,
                   (void *)0x0);
      }
      else {
        wVar5 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                                 ,L'ŵ',(uint)(sparse->type == DATA),"sparse->type == DATA",
                                 (void *)0x0);
        if (wVar5 != L'\0') {
          wVar5 = L'Ŷ';
          pcVar13 = "\' \'";
          cVar12 = ' ';
          goto LAB_001c0f81;
        }
      }
      v1 = v1 + sparse->size;
      sparse = sparse + 1;
    }
    local_60 = (ulong)((int)local_60 + (uint)bVar3);
    while( true ) {
      sVar11 = bytes_read;
      pvVar4 = buff;
      uVar1 = sparse->size + v1;
      uVar2 = offset + bytes_read;
      if ((long)uVar2 < (long)uVar1) break;
      pvVar9 = (void *)((long)buff + (v1 - offset) + sparse->size);
      if (sparse->type == DATA) {
        wVar5 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                                 ,L'Ƒ',(uint)(uVar1 <= uVar2),
                                 "expected_offset + sparse->size <= offset + bytes_read",(void *)0x0
                                );
        if (wVar5 != L'\0') {
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                           ,L'ƒ',(uint)(_v1 == (void *)((v1 - offset) + (long)buff)),
                           "start == (const char *)buff + (size_t)(expected_offset - offset)",
                           (void *)0x0);
          sVar11 = (long)pvVar9 - (long)_v1;
          wVar5 = L'Ɠ';
          pcVar13 = "\' \'";
          cVar12 = ' ';
          goto LAB_001c1099;
        }
      }
      else {
        if (sparse->type != HOLE) break;
        if ((void *)((long)buff + bytes_read) < pvVar9) {
          pvVar9 = (void *)((long)buff + bytes_read);
        }
        sVar11 = (long)pvVar9 - (long)_v1;
        wVar5 = L'ƈ';
        pcVar13 = "\'\\0\'";
        cVar12 = '\0';
LAB_001c1099:
        assertion_memory_filled_with
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,wVar5,_v1,"start",sVar11,"end - start",cVar12,pcVar13,(void *)0x0);
      }
      v1 = v1 + sparse->size;
      sparse = sparse + 1;
      _v1 = pvVar9;
    }
    if (v1 < (long)uVar2) {
      if (sparse->type == HOLE) {
        wVar5 = L'ƣ';
        pcVar13 = "\'\\0\'";
        cVar12 = '\0';
      }
      else {
        wVar5 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                                 ,L'Ƥ',(uint)(sparse->type == DATA),"sparse->type == DATA",
                                 (void *)0x0);
        if (wVar5 == L'\0') goto LAB_001c1155;
        wVar5 = L'ƥ';
        pcVar13 = "\' \'";
        cVar12 = ' ';
      }
      assertion_memory_filled_with
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                 ,wVar5,_v1,"start",(long)pvVar4 + (sVar11 - (long)_v1),"end - start",cVar12,pcVar13
                 ,(void *)0x0);
    }
LAB_001c1155:
    lVar10 = bytes_read + offset;
  } while( true );
}

Assistant:

static void
verify_sparse_file(struct archive *a, const char *path,
    const struct sparse *sparse, int expected_holes)
{
	struct archive_entry *ae;
	const void *buff;
	size_t bytes_read;
	int64_t offset, expected_offset, last_offset;
	int holes_seen = 0;

	create_sparse_file(path, sparse);
	assert((ae = archive_entry_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, path));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));

	expected_offset = 0;
	last_offset = 0;
	while (ARCHIVE_OK == archive_read_data_block(a, &buff, &bytes_read,
	    &offset)) {
		const char *start = buff;
#if DEBUG
		fprintf(stderr, "%s: bytes_read=%d offset=%d\n", path, (int)bytes_read, (int)offset);
#endif
		if (offset > last_offset) {
			++holes_seen;
		}
		/* Blocks entirely before the data we just read. */
		while (expected_offset + (int64_t)sparse->size < offset) {
#if DEBUG
			fprintf(stderr, "    skipping expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
			/* Must be holes. */
			assert(sparse->type == HOLE);
			expected_offset += sparse->size;
			++sparse;
		}
		/* Block that overlaps beginning of data */
		if (expected_offset < offset
		    && expected_offset + (int64_t)sparse->size <= offset + (int64_t)bytes_read) {
			const char *end = (const char *)buff + (expected_offset - offset) + (size_t)sparse->size;
#if DEBUG
			fprintf(stderr, "    overlapping hole expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
			if (sparse->type == HOLE) {
				assertMemoryFilledWith(start, end - start, '\0');
			} else if (assert(sparse->type == DATA)) {
				assertMemoryFilledWith(start, end - start, ' ');
			}
			start = end;
			expected_offset += sparse->size;
			++sparse;
		}
		/* Blocks completely contained in data we just read. */
		while (expected_offset + (int64_t)sparse->size <= offset + (int64_t)bytes_read) {
			const char *end = (const char *)buff + (expected_offset - offset) + (size_t)sparse->size;
			if (sparse->type == HOLE) {
#if DEBUG
				fprintf(stderr, "    contained hole expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif

				/* verify data corresponding to hole is '\0' */
				if (end > (const char *)buff + bytes_read) {
					end = (const char *)buff + bytes_read;
				}
				assertMemoryFilledWith(start, end - start, '\0');
				start = end;
				expected_offset += sparse->size;
				++sparse;
			} else if (sparse->type == DATA) {
#if DEBUG
				fprintf(stderr, "    contained data expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
				/* verify data corresponding to hole is ' ' */
				if (assert(expected_offset + sparse->size <= offset + bytes_read)) {
					assert(start == (const char *)buff + (size_t)(expected_offset - offset));
					assertMemoryFilledWith(start, end - start, ' ');
				}
				start = end;
				expected_offset += sparse->size;
				++sparse;
			} else {
				break;
			}
		}
		/* Block that overlaps end of data */
		if (expected_offset < offset + (int64_t)bytes_read) {
			const char *end = (const char *)buff + bytes_read;
#if DEBUG
			fprintf(stderr, "    trailing overlap expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
			if (sparse->type == HOLE) {
				assertMemoryFilledWith(start, end - start, '\0');
			} else if (assert(sparse->type == DATA)) {
				assertMemoryFilledWith(start, end - start, ' ');
			}
		}
		last_offset = offset + bytes_read;
	}
	/* Count a hole at EOF? */
	if (last_offset < archive_entry_size(ae)) {
		++holes_seen;
	}

	/* Verify blocks after last read */
	while (sparse->type == HOLE) {
		expected_offset += sparse->size;
		++sparse;
	}
	assert(sparse->type == END);
	assertEqualInt(expected_offset, archive_entry_size(ae));

	failure("%s", path);
	assertEqualInt(holes_seen, expected_holes);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	archive_entry_free(ae);
}